

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDateTime.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::XMLDateTime::searchMiliSeconds
          (XMLDateTime *this,XMLCh **miliStartPtr,XMLCh **miliEndPtr)

{
  XMLCh *pXVar1;
  XMLCh XVar2;
  int iVar3;
  XMLCh *pXVar4;
  
  *miliEndPtr = (XMLCh *)0x0;
  *miliStartPtr = (XMLCh *)0x0;
  iVar3 = XMLString::indexOf(this->fBuffer,L'.');
  if (iVar3 != -1) {
    pXVar4 = this->fBuffer + (long)iVar3 + 1;
    *miliStartPtr = pXVar4;
    do {
      XVar2 = *pXVar4;
      pXVar4 = pXVar4 + 1;
    } while (0xfff5 < (ushort)(XVar2 + L'ￆ'));
    do {
      pXVar1 = pXVar4 + -2;
      pXVar4 = pXVar4 + -1;
    } while (*pXVar1 == L'0');
    *miliEndPtr = pXVar4;
  }
  return;
}

Assistant:

void XMLDateTime::searchMiliSeconds(XMLCh*& miliStartPtr, XMLCh*& miliEndPtr) const
{
    miliStartPtr = miliEndPtr = 0;

    int milisec = XMLString::indexOf(fBuffer, MILISECOND_SEPARATOR);
    if (milisec == -1)
        return;

    miliStartPtr = fBuffer + milisec + 1;
    miliEndPtr   = miliStartPtr;
    while (*miliEndPtr)
    {
        if ((*miliEndPtr < chDigit_0) || (*miliEndPtr > chDigit_9))
            break;

        miliEndPtr++;
    }

    //remove trailing zeros
    while( *(miliEndPtr - 1) == chDigit_0)
        miliEndPtr--;

    return;
}